

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict
get_int_node_from_repr
          (c2m_ctx_t c2m_ctx,char *repr,char **stop,int base,int uns_p,int long_p,int llong_p,
          pos_t pos)

{
  ulonglong ul;
  mir_ullong ull;
  int long_p_local;
  int uns_p_local;
  int base_local;
  char **stop_local;
  char *repr_local;
  c2m_ctx_t c2m_ctx_local;
  
  ul = strtoull(repr,stop,base);
  if (llong_p == 0) {
    if (long_p == 0) {
      if (uns_p == 0) {
        if (ul < 0x80000000) {
          c2m_ctx_local = (c2m_ctx_t)new_i_node(c2m_ctx,ul,pos);
        }
        else if ((base == 10) || (0xffffffff < ul)) {
          if (ul < 0x8000000000000000) {
            c2m_ctx_local = (c2m_ctx_t)new_l_node(c2m_ctx,ul,pos);
          }
          else {
            c2m_ctx_local = (c2m_ctx_t)new_ul_node(c2m_ctx,ul,pos);
          }
        }
        else {
          c2m_ctx_local = (c2m_ctx_t)new_u_node(c2m_ctx,ul,pos);
        }
      }
      else if (ul < 0x100000000) {
        c2m_ctx_local = (c2m_ctx_t)new_u_node(c2m_ctx,ul,pos);
      }
      else {
        c2m_ctx_local = (c2m_ctx_t)new_ul_node(c2m_ctx,ul,pos);
      }
    }
    else if ((uns_p == 0) && (ul < 0x8000000000000000)) {
      c2m_ctx_local = (c2m_ctx_t)new_l_node(c2m_ctx,ul,pos);
    }
    else {
      c2m_ctx_local = (c2m_ctx_t)new_ul_node(c2m_ctx,ul,pos);
    }
  }
  else if ((uns_p == 0) && ((base == 10 || (ul < 0x8000000000000000)))) {
    c2m_ctx_local = (c2m_ctx_t)new_ll_node(c2m_ctx,ul,pos);
  }
  else {
    c2m_ctx_local = (c2m_ctx_t)new_ull_node(c2m_ctx,ul,pos);
  }
  return (node_t_conflict)c2m_ctx_local;
}

Assistant:

static node_t get_int_node_from_repr (c2m_ctx_t c2m_ctx, const char *repr, char **stop, int base,
                                      int uns_p, int long_p, int llong_p, pos_t pos) {
  mir_ullong ull = strtoull (repr, stop, base);

  if (llong_p) {
    if (!uns_p && (base == 10 || ull <= MIR_LLONG_MAX)) return new_ll_node (c2m_ctx, ull, pos);
    return new_ull_node (c2m_ctx, ull, pos);
  }
  if (long_p) {
    if (!uns_p && ull <= MIR_LONG_MAX) return new_l_node (c2m_ctx, (long) ull, pos);
    if (ull <= MIR_ULONG_MAX) return new_ul_node (c2m_ctx, (unsigned long) ull, pos);
    if (!uns_p && (base == 10 || ull <= MIR_LLONG_MAX)) return new_ll_node (c2m_ctx, ull, pos);
    return new_ull_node (c2m_ctx, ull, pos);
  }
  if (uns_p) {
    if (ull <= MIR_UINT_MAX) return new_u_node (c2m_ctx, (unsigned long) ull, pos);
    if (ull <= MIR_ULONG_MAX) return new_ul_node (c2m_ctx, (unsigned long) ull, pos);
    return new_ull_node (c2m_ctx, ull, pos);
  }
  if (ull <= MIR_INT_MAX) return new_i_node (c2m_ctx, (long) ull, pos);
  if (base != 10 && ull <= MIR_UINT_MAX) return new_u_node (c2m_ctx, (unsigned long) ull, pos);
  if (ull <= MIR_LONG_MAX) return new_l_node (c2m_ctx, (long) ull, pos);
  if (ull <= MIR_ULONG_MAX) return new_ul_node (c2m_ctx, (unsigned long) ull, pos);
  if (base == 10 || ull <= MIR_LLONG_MAX) return new_ll_node (c2m_ctx, ull, pos);
  return new_ull_node (c2m_ctx, ull, pos);
}